

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v10::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  char *__result;
  char *pcVar1;
  char *in_RDX;
  char *in_RSI;
  buffer<char> *in_RDI;
  size_t free_cap;
  type count;
  size_t in_stack_ffffffffffffffc8;
  
  for (; in_RSI != in_RDX; in_RSI = __result + (long)in_RSI) {
    __result = (char *)to_unsigned<long>(0x1aa08f);
    try_reserve(in_RDI,in_stack_ffffffffffffffc8);
    pcVar1 = (char *)(in_RDI->capacity_ - in_RDI->size_);
    if (pcVar1 < __result) {
      __result = pcVar1;
    }
    std::uninitialized_copy_n<char_const*,unsigned_long,char*>
              (in_RSI,(unsigned_long)in_RDX,__result);
    in_RDI->size_ = (size_t)(__result + in_RDI->size_);
  }
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  while (begin != end) {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, ptr_ + size_);
    size_ += count;
    begin += count;
  }
}